

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O2

void Tim_ManBlackBoxIoNum(Tim_Man_t *p,int *pnBbIns,int *pnBbOuts)

{
  int iVar1;
  void *pvVar2;
  int i;
  Vec_Ptr_t *p_00;
  
  *pnBbOuts = 0;
  *pnBbIns = 0;
  p_00 = p->vBoxes;
  if ((p_00 != (Vec_Ptr_t *)0x0) && (iVar1 = p_00->nSize, iVar1 != 0)) {
    for (i = 0; i < iVar1; i = i + 1) {
      pvVar2 = Vec_PtrEntry(p_00,i);
      if (*(int *)((long)pvVar2 + 0x18) != 0) {
        iVar1 = Tim_ManBoxInputNum(p,i);
        *pnBbIns = *pnBbIns + iVar1;
        iVar1 = Tim_ManBoxOutputNum(p,i);
        *pnBbOuts = *pnBbOuts + iVar1;
      }
      p_00 = p->vBoxes;
      iVar1 = p_00->nSize;
    }
  }
  return;
}

Assistant:

void Tim_ManBlackBoxIoNum( Tim_Man_t * p, int * pnBbIns, int * pnBbOuts )
{
    Tim_Box_t * pBox;
    int i;
    *pnBbIns = *pnBbOuts = 0;
    if ( Tim_ManBoxNum(p) )
        Tim_ManForEachBox( p, pBox, i )
        {
            if ( !pBox->fBlack )
                continue;
            *pnBbIns  += Tim_ManBoxInputNum( p, i );
            *pnBbOuts += Tim_ManBoxOutputNum( p, i );
        }
}